

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineValidator.cpp
# Opt level: O1

Result * CoreML::validate<(MLModelType)201>(Result *__return_storage_ptr__,Model *pipeline)

{
  undefined1 *puVar1;
  
  if (pipeline->_oneof_case_[0] == 0xc9) {
    puVar1 = (undefined1 *)(pipeline->Type_).pipelineclassifier_;
  }
  else {
    puVar1 = Specification::_PipelineRegressor_default_instance_;
  }
  puVar1 = (undefined1 *)((PipelineClassifier *)puVar1)->pipeline_;
  if ((Pipeline *)puVar1 == (Pipeline *)0x0) {
    puVar1 = Specification::_Pipeline_default_instance_;
  }
  validate(__return_storage_ptr__,pipeline,(Pipeline *)puVar1);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_pipelineRegressor>(const Specification::Model& pipeline) {
        const auto& pipelineParams = pipeline.pipelineregressor().pipeline();
        // TODO -- validate regressor interface
        return validate(pipeline, pipelineParams);
    }